

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::cni_helper<bool_(*)(const_cs::numeric_&),_bool_(*)(const_cs::numeric_&)>::call
          (cni_helper<bool_(*)(const_cs::numeric_&),_bool_(*)(const_cs::numeric_&)> *this,
          vector *args)

{
  runtime_error *this_00;
  vector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 8) {
    local_b8._M_dataplus._M_p._0_1_ =
         _call<0>((cni_helper<bool_(*)(const_cs::numeric_&),_bool_(*)(const_cs::numeric_&)> *)args,
                  in_RDX,(sequence<0> *)&cov::make_sequence<0,0>::result);
    any::make_constant<bool,bool_const&>((any *)this,(bool *)&local_b8);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_78,1);
  std::operator+(&local_58,"Wrong size of the arguments. Expected ",&local_78);
  std::operator+(&local_38,&local_58,", provided ");
  std::__cxx11::to_string
            (&local_98,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_b8,&local_38,&local_98);
  cs::runtime_error::runtime_error(this_00,&local_b8);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}